

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

void __thiscall
indk::NeuralNet::doSignalProcessStart
          (NeuralNet *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *Xx,EntryList *entries)

{
  _Rb_tree_header *p_Var1;
  key_type *pkVar2;
  void *pvVar3;
  undefined8 uVar4;
  _Tuple_impl<4UL,_int> _Var5;
  _Head_base<3UL,_void_*,_false> this_00;
  _Head_base<2UL,_void_*,_false> this_01;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  Computer *pCVar9;
  int64_t tn;
  int64_t iVar10;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var11;
  vector<float,_std::allocator<float>_> *__x;
  pointer ppVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  _Rb_tree_color _Var17;
  key_type *__k;
  long tT;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *we;
  key_type *__k_00;
  float X_00;
  pair<long,_float> pVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  waiting;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_void_*,_int>_> to;
  vector<float,_std::allocator<float>_> X;
  undefined1 local_100 [32];
  long local_e0;
  pointer local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  int64_t local_b0;
  vector<float,_std::allocator<float>_> *local_a8;
  EntryList *local_a0;
  vector<float,_std::allocator<float>_> *local_98;
  pointer local_90;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  local_88;
  
  local_b0 = this->t;
  __x = (Xx->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (Xx->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = entries;
  if (__x != local_a8) {
    p_Var1 = &(this->Latencies)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_98 = __x;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_88,__x);
      ppVar12 = (local_a0->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_90 = (local_a0->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar12 != local_90) {
        local_e0 = 0;
        do {
          pkVar2 = (ppVar12->second).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_d8 = ppVar12;
          for (__k = (ppVar12->second).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; __k != pkVar2; __k = __k + 1) {
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                    ::find(&(this->Neurons)._M_t,__k);
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&(this->Latencies)._M_t,__k);
            if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
              _Var17 = _S_red;
            }
            else {
              _Var17 = iVar8._M_node[2]._M_color;
            }
            Neuron::getWaitingEntries_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_100,*(Neuron **)(iVar7._M_node + 2));
            uVar4 = local_100._8_8_;
            for (__k_00 = (key_type *)local_100._0_8_; __k_00 != (key_type *)uVar4;
                __k_00 = __k_00 + 1) {
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&(this->Latencies)._M_t,__k_00);
              if (((_Rb_tree_header *)iVar8._M_node != p_Var1) &&
                 ((int)_Var17 < (int)iVar8._M_node[2]._M_color)) {
                Neuron::doSignalSendEntry(*(Neuron **)(iVar7._M_node + 2),__k_00,0.0,0);
              }
            }
            if ((_Rb_tree_header *)iVar7._M_node !=
                &(this->Neurons)._M_t._M_impl.super__Rb_tree_header) {
              Neuron::doSignalSendEntry
                        (*(Neuron **)(iVar7._M_node + 2),&local_d8->first,
                         *(float *)(CONCAT44(local_88.
                                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                             .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                             super__Tuple_impl<3UL,_void_*,_int>._4_4_,
                                             local_88.
                                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                             .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                             super__Tuple_impl<3UL,_void_*,_int>.
                                             super__Tuple_impl<4UL,_int>.
                                             super__Head_base<4UL,_int,_false>._M_head_impl) +
                                   local_e0 * 4),this->t);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_100);
          }
          local_e0 = local_e0 + 1;
          ppVar12 = local_d8 + 1;
        } while (ppVar12 != local_90);
      }
      this->t = this->t + 1;
      pvVar3 = (void *)CONCAT44(local_88.
                                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                super__Tuple_impl<3UL,_void_*,_int>._4_4_,
                                local_88.
                                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                super__Tuple_impl<3UL,_void_*,_int>.super__Tuple_impl<4UL,_int>.
                                super__Head_base<4UL,_int,_false>._M_head_impl);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_88.
                                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                     .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                     super__Head_base<2UL,_void_*,_false>._M_head_impl -
                               (long)pvVar3);
      }
      __x = local_98 + 1;
    } while (__x != local_a8);
  }
  iVar6 = System::getComputeBackendKind();
  if (iVar6 == 2) {
    pCVar9 = System::getComputeBackend();
    (*pCVar9->_vptr_Computer[2])(pCVar9);
  }
  lVar13 = 1;
  if ((Xx->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (Xx->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar13 = this->t - local_b0;
  }
  if (lVar13 != 0) {
    lVar15 = 0;
    do {
      p_Var11 = &((this->Links).
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
      ;
      p_Var18 = &((this->Links).
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
      ;
      if (p_Var11 == p_Var18) {
        uVar14 = 0;
        p_Var18 = p_Var11;
      }
      else {
        uVar14 = 0;
        do {
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          ::_Tuple_impl(&local_88,p_Var11);
          local_100._0_8_ = (key_type *)(local_100 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,
                     local_88.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p,
                     local_88.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p +
                     local_88.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_string_length);
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,
                     local_88.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p,
                     local_88.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p +
                     local_88.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_string_length);
          this_01._M_head_impl =
               local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Head_base<2UL,_void_*,_false>.
               _M_head_impl;
          this_00._M_head_impl =
               local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Tuple_impl<3UL,_void_*,_int>.
               super__Head_base<3UL,_void_*,_false>._M_head_impl;
          _Var5.super__Head_base<4UL,_int,_false>._M_head_impl =
               local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Tuple_impl<3UL,_void_*,_int>.
               super__Tuple_impl<4UL,_int>.super__Head_base<4UL,_int,_false>._M_head_impl;
          tn = Neuron::getTime((Neuron *)
                               local_88.
                               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                               super__Tuple_impl<3UL,_void_*,_int>.
                               super__Head_base<3UL,_void_*,_false>._M_head_impl);
          iVar10 = Neuron::getTime((Neuron *)this_00._M_head_impl);
          bVar16 = true;
          if (iVar10 != this->t) {
            X_00 = 0.0;
            if (tn != 0 || -1 < (int)_Var5.super__Head_base<4UL,_int,_false>._M_head_impl) {
              tT = tn - (ulong)((uint)_Var5.super__Head_base<4UL,_int,_false>._M_head_impl >> 0x1f);
              iVar6 = Neuron::getState((Neuron *)this_01._M_head_impl,tT);
              if (iVar6 != 2) {
                iVar6 = System::getComputeBackendKind();
                bVar16 = iVar6 == 2;
                goto LAB_00110bb0;
              }
              pVar19 = Neuron::doSignalReceive((Neuron *)this_01._M_head_impl,tT);
              X_00 = pVar19.second;
            }
            Neuron::doSignalSendEntry((Neuron *)this_00._M_head_impl,(string *)local_100,X_00,tn);
            iVar6 = System::getComputeBackendKind();
            if (iVar6 == 2) {
              bVar16 = tn == this->t ||
                       (Xx->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start !=
                       (Xx->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              bVar16 = tn == this->t;
            }
          }
LAB_00110bb0:
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          if ((key_type *)local_100._0_8_ != (key_type *)(local_100 + 0x10)) {
            operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p !=
              &local_88.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2) {
            operator_delete(local_88.
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p,
                            local_88.
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p !=
              &local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2) {
            operator_delete(local_88.
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                            .
                            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p,
                            local_88.
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                            .
                            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl.field_2._M_allocated_capacity + 1);
          }
          uVar14 = (ulong)((int)uVar14 + (uint)bVar16);
          p_Var11 = p_Var11 + 1;
        } while (p_Var11 != p_Var18);
        p_Var11 = &((this->Links).
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
        ;
        p_Var18 = &((this->Links).
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
        ;
      }
      if (((long)p_Var11 - (long)p_Var18 >> 3) * 0x2e8ba2e8ba2e8ba3 - uVar14 == 0) {
        lVar15 = lVar15 + 1;
      }
      else if ((Xx->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start ==
               (Xx->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
        pCVar9 = System::getComputeBackend();
        (*pCVar9->_vptr_Computer[2])(pCVar9);
      }
    } while (lVar15 != lVar13);
  }
  return;
}

Assistant:

void indk::NeuralNet::doSignalProcessStart(const std::vector<std::vector<float>>& Xx, const EntryList& entries) {
    float value;
    int d = 0;

    int64_t dt = t;

    for (auto X: Xx) {
        int xi = 0;
        for (auto &e: entries) {
            for (auto &en: e.second) {
                auto n = Neurons.find(en);

                auto lto = Latencies.find(en);
                auto latencyto = lto != Latencies.end() ? lto->second : 0;
                auto waiting = n -> second -> getWaitingEntries();
                for (auto &we: waiting) {
                    auto nprev = Latencies.find(we);
                    if (nprev != Latencies.end() && nprev->second > latencyto) {
                        n -> second -> doSignalSendEntry(we, 0, 0);
                    }
                }

                if (n != Neurons.end())
                    n -> second -> doSignalSendEntry(e.first, X[xi], t);
            }
            xi++;
        }
        t++;
    }

    if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL)
        indk::System::getComputeBackend() -> doWaitTarget();

    dt = t - dt;
    if (Xx.empty()) dt = 1;
    int64_t lt = 0;

    while (lt != dt) {
        d = 0;

        for (auto l: Links) {
            auto from = std::get<0>(l);
            auto to = std::get<1>(l);

            auto nfrom = (indk::Neuron*)std::get<2>(l);
            auto nto = (indk::Neuron*)std::get<3>(l);
            auto latency = std::get<4>(l);
            auto time = nto -> getTime();

            if (nto->getTime() == t) {
                d++;
                continue;
            }

            value = 0;
            if (!time && latency >= 0 || time) {
                auto shift = (bool)latency;
                if (latency > 0) shift = false;
                if (nfrom->getState(time-shift) != indk::Neuron::States::Computed) {
                    if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL)
                        d++;
                    continue;
                }
                value = nfrom -> doSignalReceive(time-shift).second;
            }


            nto -> doSignalSendEntry(from, value, time);

            if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL) {
                if (!Xx.empty() || Xx.empty() && time == t) {
                    d++;
                }
            } else if (time == t) {
                d++;
            }
        }

        if (d == Links.size()) {
            lt++;
        } else if (Xx.empty()) indk::System::getComputeBackend() -> doWaitTarget();
    }
}